

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilUtil.c
# Opt level: O3

int Extra_UtilGetopt(int argc,char **argv,char *optstring)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  uint __c;
  char *pcVar4;
  
  globalUtilOptarg = (char *)0x0;
  if ((pScanStr == (char *)0x0) || (cVar1 = *pScanStr, pcVar4 = pScanStr, cVar1 == '\0')) {
    if (globalUtilOptind == 0) {
      globalUtilOptind = 1;
    }
    if (argc <= globalUtilOptind) {
      globalUtilOptarg = (char *)0x0;
      return -1;
    }
    pcVar2 = argv[globalUtilOptind];
    if (*pcVar2 != '-') {
      globalUtilOptarg = (char *)0x0;
      return -1;
    }
    if (pcVar2[1] == '\0') {
      globalUtilOptarg = (char *)0x0;
      return -1;
    }
    pcVar4 = pcVar2 + 1;
    globalUtilOptind = globalUtilOptind + 1;
    cVar1 = *pcVar4;
    if ((cVar1 == '-') && (pcVar2[2] == '\0')) {
      globalUtilOptarg = (char *)0x0;
      return -1;
    }
  }
  pcVar4 = pcVar4 + 1;
  __c = (uint)cVar1;
  pScanStr = pcVar4;
  pcVar2 = strchr(optstring,__c);
  if ((cVar1 == ':') || (pcVar2 == (char *)0x0)) {
    pcVar4 = *argv;
    pcVar2 = "%s: unknown option %c\n";
  }
  else {
    if (pcVar2[1] != ':') {
      return __c;
    }
    if (*pcVar4 != '\0') {
      globalUtilOptarg = pcVar4;
      pScanStr = (char *)0x0;
      return __c;
    }
    lVar3 = (long)globalUtilOptind;
    if (globalUtilOptind < argc) {
      globalUtilOptind = globalUtilOptind + 1;
      globalUtilOptarg = argv[lVar3];
      return __c;
    }
    pcVar4 = *argv;
    pcVar2 = "%s: %c requires an argument\n";
  }
  fprintf(_stderr,pcVar2,pcVar4,(ulong)__c);
  return 0x3f;
}

Assistant:

int Extra_UtilGetopt( int argc, char *argv[], const char *optstring )
{
    register int c;
    register const char *place;

    globalUtilOptarg = NULL;

    if (pScanStr == NULL || *pScanStr == '\0') 
    {
        if (globalUtilOptind == 0) 
            globalUtilOptind++;
        if (globalUtilOptind >= argc) 
            return EOF;
        place = argv[globalUtilOptind];
        if (place[0] != '-' || place[1] == '\0') 
            return EOF;
        globalUtilOptind++;
        if (place[1] == '-' && place[2] == '\0') 
            return EOF;
        pScanStr = place+1;
    }

    c = *pScanStr++;
    place = strchr(optstring, c);
    if (place == NULL || c == ':') {
        (void) fprintf(stderr, "%s: unknown option %c\n", argv[0], c);
        return '?';
    }
    if (*++place == ':') 
    {
        if (*pScanStr != '\0') 
        {
            globalUtilOptarg = pScanStr;
            pScanStr = NULL;
        } 
        else 
        {
            if (globalUtilOptind >= argc) 
            {
                (void) fprintf(stderr, "%s: %c requires an argument\n", 
                    argv[0], c);
                return '?';
            }
            globalUtilOptarg = argv[globalUtilOptind];
            globalUtilOptind++;
        }
    }
    return c;
}